

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxConversion.cpp
# Opt level: O1

String * __thiscall
Jinx::Impl::GuidToString_abi_cxx11_(String *__return_storage_ptr__,Impl *this,Guid *value)

{
  size_t sVar1;
  char buffer [64];
  
  snprintf(buffer,0x40,"%.*X-%.*X-%.*X-%.*X%.*X-%.*X%.*X%.*X%.*X%.*X%.*X",8,(ulong)*(uint *)this,4,
           (ulong)*(ushort *)(this + 4),4,(ulong)*(ushort *)(this + 6),2,(ulong)(byte)this[8],2,
           (ulong)(byte)this[9],2,(ulong)(byte)this[10],2,(ulong)(byte)this[0xb],2,
           (ulong)(byte)this[0xc],2,(ulong)(byte)this[0xd],2,(ulong)(byte)this[0xe],2,
           (ulong)(byte)this[0xf]);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(buffer);
  std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)
             __return_storage_ptr__,buffer,buffer + sVar1);
  return __return_storage_ptr__;
}

Assistant:

inline_t String GuidToString(const Guid & value)
	{
		char buffer[64];
		snprintf(
			buffer,
			std::size(buffer),
			"%.*X-%.*X-%.*X-%.*X%.*X-%.*X%.*X%.*X%.*X%.*X%.*X",
			8, value.data1,
			4, value.data2,
			4, value.data3,
			2, value.data4[0],
			2, value.data4[1],
			2, value.data4[2],
			2, value.data4[3],
			2, value.data4[4],
			2, value.data4[5],
			2, value.data4[6],
			2, value.data4[7]
		);
		return String(buffer);
	}